

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void IsoWriter::writeEntity(FileEntryInfo *dir)

{
  bool bVar1;
  reference ppFVar2;
  FileEntryInfo **i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1_1;
  FileEntryInfo **i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_> *__range1;
  FileEntryInfo *dir_local;
  
  FileEntryInfo::serialize(dir);
  __end1 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::begin(&dir->m_files);
  i = (FileEntryInfo **)
      std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::end(&dir->m_files);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
              ::operator*(&__end1);
    writeEntity(*ppFVar2);
    __gnu_cxx::
    __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::begin(&dir->m_subDirs);
  i_1 = (FileEntryInfo **)
        std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>::end(&dir->m_subDirs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
                        *)&i_1);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
              ::operator*(&__end1_1);
    writeEntity(*ppFVar2);
    __gnu_cxx::
    __normal_iterator<FileEntryInfo_*const_*,_std::vector<FileEntryInfo_*,_std::allocator<FileEntryInfo_*>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void IsoWriter::writeEntity(const FileEntryInfo *dir)
{
    dir->serialize();
    for (const auto &i : dir->m_files) writeEntity(i);
    for (const auto &i : dir->m_subDirs) writeEntity(i);
}